

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O0

int ca_blob_compare(void *av,void *bv)

{
  long lVar1;
  long lVar2;
  strbuf *bpk;
  strbuf *apk;
  host_ca *b;
  host_ca *a;
  void *bv_local;
  void *av_local;
  
  lVar1 = *(long *)((long)av + 8);
  lVar2 = *(long *)((long)bv + 8);
  if (*(ulong *)(lVar1 + 0x10) < *(ulong *)(lVar2 + 0x10)) {
    av_local._4_4_ = -1;
  }
  else if (*(ulong *)(lVar2 + 0x10) < *(ulong *)(lVar1 + 0x10)) {
    av_local._4_4_ = 1;
  }
  else {
    av_local._4_4_ = memcmp(*(void **)(lVar1 + 8),*(void **)(lVar2 + 8),*(size_t *)(lVar1 + 0x10));
  }
  return av_local._4_4_;
}

Assistant:

static int ca_blob_compare(void *av, void *bv)
{
    host_ca *a = (host_ca *)av, *b = (host_ca *)bv;
    strbuf *apk = a->ca_public_key, *bpk = b->ca_public_key;
    /* Ordering by public key is arbitrary here, so do whatever is easiest */
    if (apk->len < bpk->len)
        return -1;
    if (apk->len > bpk->len)
        return +1;
    return memcmp(apk->u, bpk->u, apk->len);
}